

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O2

int __thiscall CVmHandleManager::alloc_handle(CVmHandleManager *this,void *item)

{
  void **ppvVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  ppvVar1 = this->handles_;
  sVar2 = this->handles_max_;
  sVar3 = 0;
  do {
    sVar4 = sVar2;
    if (sVar2 == sVar3) {
LAB_0023b39e:
      this->handles_max_ = sVar2 + 0x20;
      ppvVar1 = (void **)realloc(ppvVar1,sVar2 * 8 + 0x100);
      this->handles_ = ppvVar1;
      for (; ppvVar1 = this->handles_, sVar2 < this->handles_max_; sVar2 = sVar2 + 1) {
        ppvVar1[sVar2] = (void *)0x0;
      }
LAB_0023b3cc:
      ppvVar1[sVar4] = item;
      return (int)sVar4 + 1;
    }
    if (ppvVar1[sVar3] == (void *)0x0) {
      sVar4 = sVar3;
      if (sVar2 != sVar3) goto LAB_0023b3cc;
      goto LAB_0023b39e;
    }
    sVar3 = sVar3 + 1;
  } while( true );
}

Assistant:

int CVmHandleManager::alloc_handle(void *item)
{
    size_t slot;

    /* scan for a free slot */
    for (slot = 0 ; slot < handles_max_ ; ++slot)
    {
        /* if this one is free, use it */
        if (handles_[slot] == 0)
            break;
    }

    /* if we didn't find a free slot, extend the array */
    if (slot == handles_max_)
    {
        size_t i;

        /* allocate a larger array */
        handles_max_ += 32;
        handles_ = (void **)
                   t3realloc(handles_, handles_max_ * sizeof(*handles_));

        /* clear out the newly-allocated slots */
        for (i = slot ; i < handles_max_ ; ++i)
            handles_[i] = 0;
    }

    /* store the new item in our pointer array */
    handles_[slot] = item;

    /* 
     *   convert the slot number to a handle by adjusting it to a 1-based
     *   index, and return the result 
     */
    return slot + 1;
}